

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefidump.cpp
# Opt level: O2

USTATUS __thiscall
UEFIDumper::dump(UEFIDumper *this,UByteArray *buffer,CBString *inPath,CBString *guid)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  USTATUS UVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  USTATUS UStack_280;
  vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> report;
  CBString reportPath;
  CBString path;
  FfsReport ffsReport;
  ofstream ofs;
  
  Bstrlib::CBString::CBString((CBString *)&ofs,inPath);
  Bstrlib::CBString::CBString(&reportPath,".dump");
  Bstrlib::CBString::operator+(&path,(CBString *)&ofs,&reportPath);
  Bstrlib::CBString::~CBString(&reportPath);
  Bstrlib::CBString::~CBString((CBString *)&ofs);
  Bstrlib::CBString::CBString((CBString *)&ofs,inPath);
  Bstrlib::CBString::CBString((CBString *)&report,".report.txt");
  Bstrlib::CBString::operator+(&reportPath,(CBString *)&ofs,(CBString *)&report);
  Bstrlib::CBString::~CBString((CBString *)&report);
  Bstrlib::CBString::~CBString((CBString *)&ofs);
  bVar2 = this->initialized;
  if ((bool)bVar2 == true) {
    bVar1 = std::operator!=(&buffer->d,&(this->currentBuffer).d);
    if (!bVar1) {
      bVar2 = this->initialized;
      goto LAB_0010cac3;
    }
    this->initialized = false;
LAB_0010cacb:
    std::__cxx11::string::_M_assign((string *)&this->currentBuffer);
    UStack_280 = FfsParser::parse(&this->ffsParser,buffer);
    if (UStack_280 != 0) goto LAB_0010cc22;
    FfsParser::outputInfo(&this->ffsParser);
    ffsReport.model = &this->model;
    FfsReport::generate(&report,&ffsReport);
    if (report.super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        report.super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::ofstream::ofstream(&ofs);
      std::ofstream::open((char *)&ofs,(_Ios_Openmode)reportPath.super_tagbstring.data);
      lVar6 = 0x10;
      for (uVar5 = 0;
          uVar5 < (ulong)(((long)report.
                                 super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)report.
                                super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18);
          uVar5 = uVar5 + 1) {
        poVar3 = std::operator<<((ostream *)&ofs,
                                 *(char **)((long)&(report.
                                                  super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _vptr_CBString + lVar6));
        std::endl<char,std::char_traits<char>>(poVar3);
        lVar6 = lVar6 + 0x18;
      }
      std::ofstream::close();
      std::ofstream::~ofstream(&ofs);
    }
    this->initialized = true;
    std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::~vector(&report);
  }
  else {
LAB_0010cac3:
    if ((bVar2 & 1) == 0) goto LAB_0010cacb;
  }
  bVar1 = isExistOnFs(&path);
  if (bVar1) {
    UStack_280 = 0x22;
  }
  else {
    bVar1 = makeDirectory(&path);
    if (bVar1) {
      bVar1 = changeDirectory(&path);
      if (bVar1) {
        this->dumped = false;
        report.super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0xffffffffffffffff;
        report.super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        report.super__Vector_base<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        TreeModel::index((TreeModel *)&ofs,(char *)this,0);
        UVar4 = recursiveDump(this,(UModelIndex *)&ofs);
        UStack_280 = 1;
        if (UVar4 == 0) {
          UStack_280 = (ulong)(((byte)~this->dumped & 1) << 3);
        }
      }
      else {
        UStack_280 = 0x24;
      }
    }
    else {
      UStack_280 = 0x23;
    }
  }
LAB_0010cc22:
  Bstrlib::CBString::~CBString(&reportPath);
  Bstrlib::CBString::~CBString(&path);
  return UStack_280;
}

Assistant:

USTATUS UEFIDumper::dump(const UByteArray & buffer, const UString & inPath, const UString & guid)
{
    UString path = UString(inPath) + UString(".dump");
    UString reportPath = UString(inPath) + UString(".report.txt");

    if (initialized) {
        // Check if called with a different buffer as before
        if (buffer != currentBuffer) {
            // Reinitalize if so
            initialized = false;
        }
    }

    if (!initialized) {
        // Fill currentBuffer
        currentBuffer = buffer;

        // Parse FFS structure
        USTATUS result = ffsParser.parse(buffer);
        if (result)
            return result;

        ffsParser.outputInfo();

        // Create ffsReport
        FfsReport ffsReport(&model);
        std::vector<UString> report = ffsReport.generate();
        if (report.size()) {
            std::ofstream ofs;
            ofs.open(reportPath, std::ofstream::out);
            for (size_t i = 0; i < report.size(); i++) {
                ofs << report[i].toLocal8Bit() << std::endl;
            }
            ofs.close();
        }
        
        initialized = true;
    }
    
    // Check for dump directory existence
    if (isExistOnFs(path))
        return U_DIR_ALREADY_EXIST;

    // Create dump directory and cd to it
    if (!makeDirectory(path))
        return U_DIR_CREATE;

    if (!changeDirectory(path))
        return U_DIR_CHANGE;
    
    dumped = false;
    USTATUS result = recursiveDump(model.index(0,0));
    if (result)
        return result;
    else if (!dumped)
        return U_ITEM_NOT_FOUND;

    return U_SUCCESS;
}